

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::refine(btSoftBody *this,ImplicitFn *ifn,btScalar accurary,bool cut)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Node *pNVar6;
  Link *pLVar7;
  Face *pFVar8;
  Link *b_00;
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  btAlignedObjectArray<btSoftBody::Link> *this_00;
  float in_XMM0_Da;
  btScalar bVar9;
  float fVar10;
  btVector3 bVar11;
  bool sg [2];
  int id_1 [2];
  int j_4;
  int j_3;
  btAlignedObjectArray<int> todelete;
  btAlignedObjectArray<int> ranks;
  int nnodes;
  int cn_1;
  int j_2;
  Node **n;
  int cn;
  int j_1;
  Link *l_3;
  int todetach;
  int id [2];
  btScalar m_1;
  btVector3 v_1;
  btVector3 x_1;
  int i_1;
  int pcount;
  btAlignedObjectArray<int> cnodes;
  Face *pft_1 [2];
  int l_2;
  int ni_2;
  int idx_1 [3];
  Face *feat_1;
  Link *pft [2];
  int ni_1;
  int idx [2];
  Link *feat;
  btScalar f_1;
  btScalar mc;
  btScalar mb;
  btScalar ma;
  btScalar m;
  btVector3 v;
  btVector3 x;
  btScalar t;
  Node *b;
  Node *a;
  Face *f;
  Link *l_1;
  Link *l;
  int ni;
  int k;
  int j;
  int i;
  int newnodes;
  btSymMatrix<int> edges;
  int ncount;
  Node *nbase;
  int in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  btSymMatrix<int> *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  undefined8 in_stack_fffffffffffffa58;
  btSoftBody *in_stack_fffffffffffffa60;
  btVector3 *in_stack_fffffffffffffa68;
  btVector3 *in_stack_fffffffffffffa70;
  byte *pbVar12;
  Link *in_stack_fffffffffffffa78;
  Link *in_stack_fffffffffffffa80;
  ImplicitFn *in_stack_fffffffffffffa88;
  Material *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined8 in_stack_fffffffffffffb10;
  btVector3 *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  btScalar local_2d8;
  btScalar bStack_2d4;
  byte local_215;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  undefined4 local_204;
  btAlignedObjectArray<int> local_1e0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Node **local_1b0;
  int local_1a8;
  int local_1a4;
  Link *local_1a0;
  int local_198;
  int local_194;
  int local_190;
  btScalar local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_174;
  undefined8 local_16c;
  undefined4 local_164;
  int local_160;
  int local_15c;
  btAlignedObjectArray<int> local_158;
  Face *local_138;
  Face *local_130;
  int local_124;
  int local_120;
  int local_11c [3];
  Face *local_110;
  Link *local_108;
  Link *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  Link *local_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  undefined8 local_cc;
  undefined8 local_c4;
  btScalar local_bc;
  btScalar bStack_b8;
  undefined8 local_b4;
  btScalar local_ac;
  Node *local_a8;
  Node *local_a0;
  Face *local_98;
  Link *local_90;
  float local_88;
  float local_84;
  Link *local_80;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  undefined4 local_54;
  int local_24;
  Node *local_20;
  byte local_15;
  float local_14;
  long *local_10;
  
  local_15 = in_DL & 1;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_20 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
  local_24 = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  local_54 = 0xfffffffe;
  btSymMatrix<int>::btSymMatrix
            ((btSymMatrix<int> *)in_stack_fffffffffffffa60,
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  local_58 = 0;
  for (local_5c = 0; iVar4 = local_5c,
      iVar3 = btAlignedObjectArray<btSoftBody::Link>::size
                        ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390)), iVar4 < iVar3;
      local_5c = local_5c + 1) {
    local_80 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_5c);
    if ((char)(local_80->field_0x24 << 7) < '\0') {
      local_84 = (float)(**(code **)(*local_10 + 0x10))(local_10,&local_80->m_n[0]->m_x);
      local_88 = (float)(**(code **)(*local_10 + 0x10))(local_10,&local_80->m_n[1]->m_x);
      bVar2 = SameSign<float>(&local_84,&local_88);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        btAlignedObjectArray<btSoftBody::Link>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_5c);
        iVar4 = btAlignedObjectArray<btSoftBody::Link>::size
                          ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
        btAlignedObjectArray<btSoftBody::Link>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),iVar4 + -1);
        btSwap<btSoftBody::Link>(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        btAlignedObjectArray<btSoftBody::Link>::pop_back
                  ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
        local_5c = local_5c + -1;
      }
    }
  }
  for (local_5c = 0; iVar4 = local_5c,
      iVar3 = btAlignedObjectArray<btSoftBody::Link>::size
                        ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390)), iVar4 < iVar3;
      local_5c = local_5c + 1) {
    local_90 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_5c);
    piVar5 = btSymMatrix<int>::operator()
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                        in_stack_fffffffffffffa38);
    *piVar5 = -1;
  }
  for (local_5c = 0; iVar4 = local_5c,
      iVar3 = btAlignedObjectArray<btSoftBody::Face>::size
                        ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0)), iVar4 < iVar3;
      local_5c = local_5c + 1) {
    local_98 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_5c);
    piVar5 = btSymMatrix<int>::operator()
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                        in_stack_fffffffffffffa38);
    *piVar5 = -1;
    piVar5 = btSymMatrix<int>::operator()
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                        in_stack_fffffffffffffa38);
    *piVar5 = -1;
    piVar5 = btSymMatrix<int>::operator()
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                        in_stack_fffffffffffffa38);
    *piVar5 = -1;
  }
  for (local_5c = 0; iVar4 = local_5c, local_5c < local_24; local_5c = local_5c + 1) {
    while (local_60 = iVar4 + 1, local_60 < local_24) {
      piVar5 = btSymMatrix<int>::operator()
                         (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                          in_stack_fffffffffffffa38);
      iVar4 = local_60;
      if (*piVar5 == -1) {
        local_a0 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_5c);
        local_a8 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_60);
        local_ac = ImplicitSolve(in_stack_fffffffffffffa88,(btVector3 *)in_stack_fffffffffffffa80,
                                 (btVector3 *)in_stack_fffffffffffffa78,
                                 (btScalar)((ulong)in_stack_fffffffffffffa70 >> 0x20),
                                 (int)in_stack_fffffffffffffa70);
        iVar4 = local_60;
        if (0.0 < local_ac) {
          bVar11 = Lerp<btVector3>(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                                   (btScalar)((ulong)in_stack_fffffffffffffa60 >> 0x20));
          local_b4 = bVar11.m_floats._8_8_;
          local_2d8 = bVar11.m_floats[0];
          bStack_2d4 = bVar11.m_floats[1];
          local_bc = local_2d8;
          bStack_b8 = bStack_2d4;
          bVar11 = Lerp<btVector3>(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                                   (btScalar)((ulong)in_stack_fffffffffffffa60 >> 0x20));
          local_c4 = bVar11.m_floats._8_8_;
          local_cc = bVar11.m_floats._0_8_;
          local_d0 = 0.0;
          if (local_a0->m_im <= 0.0) {
            if (local_a8->m_im <= 0.0) {
              local_d0 = 0.0;
            }
            else {
              local_a8->m_im = local_a8->m_im / 0.5;
              local_d0 = 1.0 / local_a8->m_im;
            }
          }
          else if (local_a8->m_im <= 0.0) {
            local_a0->m_im = local_a0->m_im / 0.5;
            local_d0 = 1.0 / local_a0->m_im;
          }
          else {
            local_d4 = 1.0 / local_a0->m_im;
            local_d8 = 1.0 / local_a8->m_im;
            local_dc = Lerp<float>(&local_d4,&local_d8,local_ac);
            local_e0 = (local_d4 + local_d8) / (local_d4 + local_d8 + local_dc);
            local_a0->m_im = 1.0 / (local_d4 * local_e0);
            local_a8->m_im = 1.0 / (local_d8 * local_e0);
            local_d0 = local_dc * local_e0;
          }
          appendNode((btSoftBody *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                     in_stack_fffffffffffffb18,(btScalar)((ulong)in_stack_fffffffffffffb10 >> 0x20))
          ;
          iVar4 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
          piVar5 = btSymMatrix<int>::operator()
                             (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                              in_stack_fffffffffffffa38);
          *piVar5 = iVar4 + -1;
          piVar5 = btSymMatrix<int>::operator()
                             (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                              in_stack_fffffffffffffa38);
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),*piVar5);
          *(undefined8 *)(pNVar6->m_v).m_floats = local_cc;
          *(undefined8 *)((pNVar6->m_v).m_floats + 2) = local_c4;
          local_58 = local_58 + 1;
          iVar4 = local_60;
        }
      }
    }
  }
  local_20 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
  local_5c = 0;
  local_68 = btAlignedObjectArray<btSoftBody::Link>::size
                       ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
  for (; local_5c < local_68; local_5c = local_5c + 1) {
    local_e8 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_5c);
    local_f0 = (int)(((long)local_e8->m_n[0] - (long)local_20) / 0x78);
    local_ec = (int)(((long)local_e8->m_n[1] - (long)local_20) / 0x78);
    if ((local_f0 < local_24) && (local_ec < local_24)) {
      piVar5 = btSymMatrix<int>::operator()
                         (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                          in_stack_fffffffffffffa38);
      local_f4 = *piVar5;
      if (0 < local_f4) {
        appendLink((btSoftBody *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),in_stack_fffffffffffffa90);
        local_108 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_5c);
        iVar4 = btAlignedObjectArray<btSoftBody::Link>::size
                          ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
        local_100 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),iVar4 + -1
                              );
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_f0);
        local_108->m_n[0] = pNVar6;
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_f4);
        local_108->m_n[1] = pNVar6;
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_f4);
        local_100->m_n[0] = pNVar6;
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_ec);
        local_100->m_n[1] = pNVar6;
      }
    }
  }
  for (local_5c = 0; iVar4 = local_5c,
      iVar3 = btAlignedObjectArray<btSoftBody::Face>::size
                        ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0)), iVar4 < iVar3;
      local_5c = local_5c + 1) {
    local_110 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_5c);
    local_11c[0] = (int)(((long)local_110->m_n[0] - (long)local_20) / 0x78);
    local_11c[1] = (int)(((long)local_110->m_n[1] - (long)local_20) / 0x78);
    local_11c[2] = (int)(((long)local_110->m_n[2] - (long)local_20) / 0x78);
    local_60 = 2;
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      if ((local_11c[local_60] < local_24) && (local_11c[local_64] < local_24)) {
        piVar5 = btSymMatrix<int>::operator()
                           (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                            in_stack_fffffffffffffa38);
        local_120 = *piVar5;
        if (0 < local_120) {
          appendFace((btSoftBody *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),in_stack_fffffffffffffa90);
          local_124 = local_64 + 1 + ((local_64 + 1) / 3) * -3;
          local_138 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                                ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_5c
                                );
          iVar4 = btAlignedObjectArray<btSoftBody::Face>::size
                            ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
          local_130 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                                ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),
                                 iVar4 + -1);
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),
                              local_11c[local_124]);
          local_138->m_n[0] = pNVar6;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),
                              local_11c[local_60]);
          local_138->m_n[1] = pNVar6;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_120);
          local_138->m_n[2] = pNVar6;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_120);
          local_130->m_n[0] = pNVar6;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),
                              local_11c[local_64]);
          local_130->m_n[1] = pNVar6;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),
                              local_11c[local_124]);
          local_130->m_n[2] = pNVar6;
          appendLink(in_stack_fffffffffffffa60,(int)((ulong)in_stack_fffffffffffffa58 >> 0x20),
                     (int)in_stack_fffffffffffffa58,
                     (Material *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                     SUB81((ulong)in_stack_fffffffffffffa48 >> 0x38,0));
          local_5c = local_5c + -1;
          break;
        }
      }
      local_60 = local_64;
    }
  }
  if ((local_15 & 1) != 0) {
    btAlignedObjectArray<int>::btAlignedObjectArray(&in_stack_fffffffffffffa40->store);
    local_15c = local_24;
    local_24 = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    local_164 = 0;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffa60,
               (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),
               (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    for (local_160 = 0; local_160 < local_24; local_160 = local_160 + 1) {
      pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_160);
      local_174 = *(undefined8 *)(pNVar6->m_x).m_floats;
      local_16c = *(undefined8 *)((pNVar6->m_x).m_floats + 2);
      if (local_160 < local_15c) {
        bVar9 = (btScalar)(**(code **)(*local_10 + 0x10))();
        bVar9 = btFabs(bVar9);
        if (bVar9 < local_14) goto LAB_0027449d;
      }
      else {
LAB_0027449d:
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_160);
        local_188 = *(undefined8 *)(pNVar6->m_v).m_floats;
        uStack_180 = *(undefined8 *)((pNVar6->m_v).m_floats + 2);
        local_18c = getMass((btSoftBody *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
        if (0.0 < local_18c) {
          local_18c = local_18c * 0.5;
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_160);
          pNVar6->m_im = pNVar6->m_im / 0.5;
        }
        appendNode((btSoftBody *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                   in_stack_fffffffffffffb18,(btScalar)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        iVar4 = btAlignedObjectArray<btSoftBody::Node>::size
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
        piVar5 = btAlignedObjectArray<int>::operator[](&local_158,local_160);
        *piVar5 = iVar4 + -1;
        piVar5 = btAlignedObjectArray<int>::operator[](&local_158,local_160);
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),*piVar5);
        *(undefined8 *)(pNVar6->m_v).m_floats = local_188;
        *(undefined8 *)((pNVar6->m_v).m_floats + 2) = uStack_180;
      }
    }
    local_20 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
    local_160 = 0;
    local_68 = btAlignedObjectArray<btSoftBody::Link>::size
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
    for (; local_160 < local_68; local_160 = local_160 + 1) {
      pLVar7 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
      local_194 = (int)((ulong)((long)pLVar7->m_n[0] - (long)local_20) >> 3) * -0x11111111;
      pLVar7 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
      local_190 = (int)((ulong)((long)pLVar7->m_n[1] - (long)local_20) >> 3) * -0x11111111;
      local_198 = 0;
      piVar5 = btAlignedObjectArray<int>::operator[](&local_158,local_194);
      if ((*piVar5 == 0) ||
         (piVar5 = btAlignedObjectArray<int>::operator[](&local_158,local_190), *piVar5 == 0)) {
        plVar1 = local_10;
        pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_194);
        fVar10 = (float)(**(code **)(*plVar1 + 0x10))(plVar1,&pNVar6->m_x);
        plVar1 = local_10;
        if (fVar10 < local_14) {
          pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_190);
          fVar10 = (float)(**(code **)(*plVar1 + 0x10))(plVar1,&pNVar6->m_x);
          if (fVar10 < local_14) {
            local_198 = local_160;
          }
        }
      }
      else {
        appendLink((btSoftBody *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),in_stack_fffffffffffffa90);
        local_198 = btAlignedObjectArray<btSoftBody::Link>::size
                              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
        local_198 = local_198 + -1;
      }
      if (local_198 != 0) {
        local_1a0 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_198)
        ;
        for (local_1a4 = 0; local_1a4 < 2; local_1a4 = local_1a4 + 1) {
          piVar5 = btAlignedObjectArray<int>::operator[]
                             (&local_158,
                              (int)((ulong)((long)local_1a0->m_n[local_1a4] - (long)local_20) >> 3)
                              * -0x11111111);
          local_1a8 = *piVar5;
          if (local_1a8 != 0) {
            pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                               ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_1a8
                               );
            local_1a0->m_n[local_1a4] = pNVar6;
          }
        }
      }
    }
    local_160 = 0;
    local_68 = btAlignedObjectArray<btSoftBody::Face>::size
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    for (; iVar4 = (int)((ulong)in_stack_fffffffffffffa58 >> 0x20), local_160 < local_68;
        local_160 = local_160 + 1) {
      pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_160);
      local_1b0 = pFVar8->m_n;
      fVar10 = (float)(**(code **)(*local_10 + 0x10))(local_10,&(*local_1b0)->m_x);
      if (((fVar10 < local_14) &&
          (fVar10 = (float)(**(code **)(*local_10 + 0x10))(local_10,&local_1b0[1]->m_x),
          fVar10 < local_14)) &&
         (fVar10 = (float)(**(code **)(*local_10 + 0x10))(local_10,&local_1b0[2]->m_x),
         fVar10 < local_14)) {
        for (local_1b4 = 0; local_1b4 < 3; local_1b4 = local_1b4 + 1) {
          piVar5 = btAlignedObjectArray<int>::operator[]
                             (&local_158,
                              (int)((ulong)((long)local_1b0[local_1b4] - (long)local_20) >> 3) *
                              -0x11111111);
          local_1b8 = *piVar5;
          if (local_1b8 != 0) {
            pNVar6 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                               ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_1b8
                               );
            local_1b0[local_1b4] = pNVar6;
          }
        }
      }
    }
    local_1bc = btAlignedObjectArray<btSoftBody::Node>::size
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    btAlignedObjectArray<int>::btAlignedObjectArray(&in_stack_fffffffffffffa40->store);
    btAlignedObjectArray<int>::btAlignedObjectArray(&in_stack_fffffffffffffa40->store);
    local_204 = 0;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffa60,iVar4,
               (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    local_160 = 0;
    local_68 = btAlignedObjectArray<btSoftBody::Link>::size
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
    for (; local_160 < local_68; local_160 = local_160 + 1) {
      for (local_208 = 0; local_208 < 2; local_208 = local_208 + 1) {
        pLVar7 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
        piVar5 = btAlignedObjectArray<int>::operator[]
                           (&local_1e0,
                            (int)((ulong)((long)pLVar7->m_n[local_208] - (long)local_20) >> 3) *
                            -0x11111111);
        *piVar5 = *piVar5 + 1;
      }
    }
    local_160 = 0;
    local_68 = btAlignedObjectArray<btSoftBody::Face>::size
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    for (; local_160 < local_68; local_160 = local_160 + 1) {
      for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
        pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_160);
        piVar5 = btAlignedObjectArray<int>::operator[]
                           (&local_1e0,
                            (int)((ulong)((long)pFVar8->m_n[local_20c] - (long)local_20) >> 3) *
                            -0x11111111);
        *piVar5 = *piVar5 + 1;
      }
    }
    local_160 = 0;
    while (iVar4 = local_160,
          iVar3 = btAlignedObjectArray<btSoftBody::Link>::size
                            ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390)),
          iVar4 < iVar3) {
      pLVar7 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
      local_214 = (int)((ulong)((long)pLVar7->m_n[0] - (long)local_20) >> 3) * -0x11111111;
      piVar5 = &local_210;
      pLVar7 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
      *piVar5 = (int)((ulong)((long)pLVar7->m_n[1] - (long)local_20) >> 3) * -0x11111111;
      pLVar7 = (Link *)btAlignedObjectArray<int>::operator[](&local_1e0,local_214);
      iVar4 = *(int *)&(pLVar7->super_Feature).super_Element.m_tag;
      pbVar12 = &local_215;
      b_00 = (Link *)btAlignedObjectArray<int>::operator[](&local_1e0,local_210);
      *pbVar12 = *(int *)&(b_00->super_Feature).super_Element.m_tag == 1;
      if ((iVar4 == 1) || ((local_215 & 1) != 0)) {
        piVar5 = btAlignedObjectArray<int>::operator[](&local_1e0,local_214);
        *piVar5 = *piVar5 + -1;
        piVar5 = btAlignedObjectArray<int>::operator[](&local_1e0,local_210);
        *piVar5 = *piVar5 + -1;
        btAlignedObjectArray<btSoftBody::Link>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_160);
        this_00 = (btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390);
        iVar4 = btAlignedObjectArray<btSoftBody::Link>::size(this_00);
        btAlignedObjectArray<btSoftBody::Link>::operator[](this_00,iVar4 + -1);
        btSwap<btSoftBody::Link>(pLVar7,b_00);
        btAlignedObjectArray<btSoftBody::Link>::pop_back
                  ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
        local_160 = local_160 + -1;
      }
      local_160 = local_160 + 1;
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x2751e3);
    btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x2751f0);
    btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x2751fd);
  }
  *(undefined1 *)(in_RDI + 0x4b4) = 1;
  btSymMatrix<int>::~btSymMatrix((btSymMatrix<int> *)0x275237);
  return;
}

Assistant:

void			btSoftBody::refine(ImplicitFn* ifn,btScalar accurary,bool cut)
{
	const Node*			nbase = &m_nodes[0];
	int					ncount = m_nodes.size();
	btSymMatrix<int>	edges(ncount,-2);
	int					newnodes=0;
	int i,j,k,ni;

	/* Filter out		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		if(l.m_bbending)
		{
			if(!SameSign(ifn->Eval(l.m_n[0]->m_x),ifn->Eval(l.m_n[1]->m_x)))
			{
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}	
	}
	/* Fill edges		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		edges(int(l.m_n[0]-nbase),int(l.m_n[1]-nbase))=-1;
	}
	for(i=0;i<m_faces.size();++i)
	{	
		Face&	f=m_faces[i];
		edges(int(f.m_n[0]-nbase),int(f.m_n[1]-nbase))=-1;
		edges(int(f.m_n[1]-nbase),int(f.m_n[2]-nbase))=-1;
		edges(int(f.m_n[2]-nbase),int(f.m_n[0]-nbase))=-1;
	}
	/* Intersect		*/ 
	for(i=0;i<ncount;++i)
	{
		for(j=i+1;j<ncount;++j)
		{
			if(edges(i,j)==-1)
			{
				Node&			a=m_nodes[i];
				Node&			b=m_nodes[j];
				const btScalar	t=ImplicitSolve(ifn,a.m_x,b.m_x,accurary);
				if(t>0)
				{
					const btVector3	x=Lerp(a.m_x,b.m_x,t);
					const btVector3	v=Lerp(a.m_v,b.m_v,t);
					btScalar		m=0;
					if(a.m_im>0)
					{
						if(b.m_im>0)
						{
							const btScalar	ma=1/a.m_im;
							const btScalar	mb=1/b.m_im;
							const btScalar	mc=Lerp(ma,mb,t);
							const btScalar	f=(ma+mb)/(ma+mb+mc);
							a.m_im=1/(ma*f);
							b.m_im=1/(mb*f);
							m=mc*f;
						}
						else
						{ a.m_im/=0.5f;m=1/a.m_im; }
					}
					else
					{
						if(b.m_im>0)
						{ b.m_im/=0.5f;m=1/b.m_im; }
						else
							m=0;
					}
					appendNode(x,m);
					edges(i,j)=m_nodes.size()-1;
					m_nodes[edges(i,j)].m_v=v;
					++newnodes;
				}
			}
		}
	}
	nbase=&m_nodes[0];
	/* Refine links		*/ 
	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&		feat=m_links[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase)};
		if((idx[0]<ncount)&&(idx[1]<ncount))
		{
			const int ni=edges(idx[0],idx[1]);
			if(ni>0)
			{
				appendLink(i);
				Link*		pft[]={	&m_links[i],
					&m_links[m_links.size()-1]};			
				pft[0]->m_n[0]=&m_nodes[idx[0]];
				pft[0]->m_n[1]=&m_nodes[ni];
				pft[1]->m_n[0]=&m_nodes[ni];
				pft[1]->m_n[1]=&m_nodes[idx[1]];
			}
		}
	}
	/* Refine faces		*/ 
	for(i=0;i<m_faces.size();++i)
	{
		const Face&	feat=m_faces[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase),
			int(feat.m_n[2]-nbase)};
		for(j=2,k=0;k<3;j=k++)
		{
			if((idx[j]<ncount)&&(idx[k]<ncount))
			{
				const int ni=edges(idx[j],idx[k]);
				if(ni>0)
				{
					appendFace(i);
					const int	l=(k+1)%3;
					Face*		pft[]={	&m_faces[i],
						&m_faces[m_faces.size()-1]};
					pft[0]->m_n[0]=&m_nodes[idx[l]];
					pft[0]->m_n[1]=&m_nodes[idx[j]];
					pft[0]->m_n[2]=&m_nodes[ni];
					pft[1]->m_n[0]=&m_nodes[ni];
					pft[1]->m_n[1]=&m_nodes[idx[k]];
					pft[1]->m_n[2]=&m_nodes[idx[l]];
					appendLink(ni,idx[l],pft[0]->m_material);
					--i;break;
				}
			}
		}
	}
	/* Cut				*/ 
	if(cut)
	{	
		btAlignedObjectArray<int>	cnodes;
		const int					pcount=ncount;
		int							i;
		ncount=m_nodes.size();
		cnodes.resize(ncount,0);
		/* Nodes		*/ 
		for(i=0;i<ncount;++i)
		{
			const btVector3	x=m_nodes[i].m_x;
			if((i>=pcount)||(btFabs(ifn->Eval(x))<accurary))
			{
				const btVector3	v=m_nodes[i].m_v;
				btScalar		m=getMass(i);
				if(m>0) { m*=0.5f;m_nodes[i].m_im/=0.5f; }
				appendNode(x,m);
				cnodes[i]=m_nodes.size()-1;
				m_nodes[cnodes[i]].m_v=v;
			}
		}
		nbase=&m_nodes[0];
		/* Links		*/ 
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			const int		id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			int				todetach=0;
			if(cnodes[id[0]]&&cnodes[id[1]])
			{
				appendLink(i);
				todetach=m_links.size()-1;
			}
			else
			{
				if((	(ifn->Eval(m_nodes[id[0]].m_x)<accurary)&&
					(ifn->Eval(m_nodes[id[1]].m_x)<accurary)))
					todetach=i;
			}
			if(todetach)
			{
				Link&	l=m_links[todetach];
				for(int j=0;j<2;++j)
				{
					int cn=cnodes[int(l.m_n[j]-nbase)];
					if(cn) l.m_n[j]=&m_nodes[cn];
				}			
			}
		}
		/* Faces		*/ 
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			Node**			n=	m_faces[i].m_n;
			if(	(ifn->Eval(n[0]->m_x)<accurary)&&
				(ifn->Eval(n[1]->m_x)<accurary)&&
				(ifn->Eval(n[2]->m_x)<accurary))
			{
				for(int j=0;j<3;++j)
				{
					int cn=cnodes[int(n[j]-nbase)];
					if(cn) n[j]=&m_nodes[cn];
				}
			}
		}
		/* Clean orphans	*/ 
		int							nnodes=m_nodes.size();
		btAlignedObjectArray<int>	ranks;
		btAlignedObjectArray<int>	todelete;
		ranks.resize(nnodes,0);
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			for(int j=0;j<2;++j) ranks[int(m_links[i].m_n[j]-nbase)]++;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			for(int j=0;j<3;++j) ranks[int(m_faces[i].m_n[j]-nbase)]++;
		}
		for(i=0;i<m_links.size();++i)
		{
			const int	id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			const bool	sg[]={	ranks[id[0]]==1,
				ranks[id[1]]==1};
			if(sg[0]||sg[1])
			{
				--ranks[id[0]];
				--ranks[id[1]];
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}
#if 0	
		for(i=nnodes-1;i>=0;--i)
		{
			if(!ranks[i]) todelete.push_back(i);
		}	
		if(todelete.size())
		{		
			btAlignedObjectArray<int>&	map=ranks;
			for(int i=0;i<nnodes;++i) map[i]=i;
			PointersToIndices(this);
			for(int i=0,ni=todelete.size();i<ni;++i)
			{
				int		j=todelete[i];
				int&	a=map[j];
				int&	b=map[--nnodes];
				m_ndbvt.remove(m_nodes[a].m_leaf);m_nodes[a].m_leaf=0;
				btSwap(m_nodes[a],m_nodes[b]);
				j=a;a=b;b=j;			
			}
			IndicesToPointers(this,&map[0]);
			m_nodes.resize(nnodes);
		}
#endif
	}
	m_bUpdateRtCst=true;
}